

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test_output.cpp
# Opt level: O3

int main(void)

{
  out_int_formatted(0x7ca);
  out_int_formatted(0x19);
  test_input_modifiers();
  out_double_formatted(1234567.89);
  print_table();
  return 0;
}

Assistant:

int main()
{
	auto birth_year{ 1994 };
	out_int_formatted(birth_year);
	out_int_formatted(25);
	test_input_modifiers();
	out_double_formatted(1234567.89);
	print_table();
}